

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O0

void ActiveLoaderInstance::Remove(void)

{
  unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_> *this;
  
  this = anon_unknown.dwarf_3a913::GetSetCurrentLoaderInstance();
  std::unique_ptr<LoaderInstance,_std::default_delete<LoaderInstance>_>::reset(this,(pointer)0x0);
  return;
}

Assistant:

void Remove() { GetSetCurrentLoaderInstance().reset(nullptr); }